

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Kernel::ByteSizeLong(Kernel *this)

{
  KernelCase KVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  Kernel *this_local;
  
  sStack_18 = 0;
  KVar1 = kernel_case(this);
  switch(KVar1) {
  case KERNEL_NOT_SET:
    break;
  case kLinearKernel:
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::LinearKernel>
                          ((this->kernel_).linearkernel_);
    sStack_18 = sStack_18 + 1;
    break;
  case kRbfKernel:
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::RBFKernel>((this->kernel_).rbfkernel_);
    sStack_18 = sStack_18 + 1;
    break;
  case kPolyKernel:
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::PolyKernel>((this->kernel_).polykernel_)
    ;
    sStack_18 = sStack_18 + 1;
    break;
  case kSigmoidKernel:
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::SigmoidKernel>
                          ((this->kernel_).sigmoidkernel_);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t Kernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Kernel)
  size_t total_size = 0;

  switch (kernel_case()) {
    // .CoreML.Specification.LinearKernel linearKernel = 1;
    case kLinearKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.linearkernel_);
      break;
    }
    // .CoreML.Specification.RBFKernel rbfKernel = 2;
    case kRbfKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.rbfkernel_);
      break;
    }
    // .CoreML.Specification.PolyKernel polyKernel = 3;
    case kPolyKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.polykernel_);
      break;
    }
    // .CoreML.Specification.SigmoidKernel sigmoidKernel = 4;
    case kSigmoidKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.sigmoidkernel_);
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}